

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O2

void __thiscall KV::KeyValues::saveToBuffer(KeyValues *this,string *out)

{
  KeyValues *sectionKV;
  KeyValues *pKVar1;
  iterator __begin1;
  anon_class_8_1_3fcf671e writeTabs;
  anon_class_16_2_01948639 writeKV;
  anon_class_16_2_b6bd5efa writeKey;
  stringstream ss;
  iterator local_208;
  anon_class_8_1_3fcf671e local_200;
  anon_class_16_2_b6bd5efa *local_1f8;
  stringstream *local_1f0;
  anon_class_8_1_3fcf671e *local_1e8;
  anon_class_16_2_01948639 *local_1e0;
  anon_class_16_2_01948639 local_1d8;
  anon_class_16_2_b6bd5efa local_1c8;
  stringstream local_1b8 [392];
  
  pKVar1 = getRoot(this);
  if ((pKVar1->keyvalues)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_1c8.writeTabs = &local_200;
    local_208.it._M_node =
         (multimap_iterator)(pKVar1->keyvalues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
    ;
    local_200.ss = (stringstream *)local_1b8;
    local_1d8.writeKey = &local_1c8;
    local_1d8.ss = (stringstream *)local_1b8;
    local_1c8.ss = (stringstream *)local_1b8;
    while (local_208.it._M_node !=
           (multimap_iterator)&(pKVar1->keyvalues)._M_t._M_impl.super__Rb_tree_header) {
      sectionKV = *(KeyValues **)((long)local_208.it._M_node + 0x40);
      if ((sectionKV->value).
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == false) {
        local_1e8 = &local_200;
        local_1f8 = &local_1c8;
        local_1f0 = local_1b8;
        local_1e0 = &local_1d8;
        const::{lambda(KV::KeyValues&,auto:1&)#1}::operator()
                  (&local_1f8,sectionKV,(anon_class_32_4_cd4c352e *)&local_1f8);
      }
      else {
        saveToBuffer::anon_class_16_2_01948639::operator()(&local_1d8,sectionKV);
      }
      iterator::operator++(&local_208);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)out,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return;
}

Assistant:

void KeyValues::saveToBuffer( std::string &out )
	{
		KeyValues &root = getRoot();

		if ( root.isEmpty() )
			return;

		std::stringstream ss;

		auto writeTabs = [ &ss ]( size_t tabDepth )
		{
			if ( tabDepth > 0 )
			{
				std::string tabs( tabDepth, '\t' );
				ss << tabs;
			}
		};

		auto writeKey = [ & ]( KeyValues &kv )
		{
			writeTabs( kv.getDepth() );
			ss << '\"' << kv.getKey() << '\"';
		};

		auto writeKV = [ & ]( KeyValues &kv )
		{
			writeKey( kv );
			ss << ' ' << '\"' << kv.getValue() << '\"' << '\n';
		};

		auto writeSectionRecursive = [ & ]( KeyValues &section ) -> void
		{
			auto writeSection = [ & ]( KeyValues &sectionKV, auto &writeFunc ) -> void
			{
				writeKey( sectionKV );

				ss << '\n';
				writeTabs( sectionKV.getDepth() );
				ss << '{' << '\n';

				for ( KeyValues &kv : sectionKV )
				{
					if ( kv.isSection() )
						writeFunc( kv, writeFunc );
					else
						writeKV( kv );
				}

				writeTabs( sectionKV.getDepth() );
				ss << '}' << '\n';

				// Write a new line if it's the end of a 'global' section
				if ( sectionKV.getDepth() == 0 )
					ss << '\n';
			};

			writeSection( section, writeSection );
		};

		for ( KeyValues &kv : root )
		{
			if ( kv.isSection() )
				writeSectionRecursive( kv );
			else
				writeKV( kv );
		}

		out = ss.str();
	}